

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O0

void __thiscall Js::StackScriptFunction::BoxState::Box(BoxState *this)

{
  code *pcVar1;
  FrameDisplay *pFVar2;
  bool bVar3;
  bool bVar4;
  ArgSlot AVar5;
  uint16 uVar6;
  BOOL BVar7;
  LocalFunctionId functionId;
  int iVar8;
  uint uVar9;
  ScriptFunction *pSVar10;
  FunctionBody *functionBody;
  undefined4 *puVar11;
  undefined4 extraout_var;
  char16 *pcVar12;
  ScriptFunction *function;
  JavascriptFunction *pJVar13;
  Type *pTVar14;
  void **ppvVar15;
  FunctionInfo *this_00;
  FunctionBody *functionBody_00;
  size_t sVar16;
  StackScriptFunction *scriptFunction;
  InterpreterStackFrame *pIVar17;
  FrameDisplay *local_258;
  InterpreterStackFrame *interpreterFrame_2;
  ScriptFunction *boxedCaller;
  Type *local_1f8;
  Type *boxedSlots;
  Type *pScope;
  FunctionProxy *functionProxy;
  ScopeSlots slots;
  Type *slotArray;
  int i_1;
  bool closureInitDone;
  InterpreterStackFrame *interpreterFrame_1;
  FrameDisplay *frameDisplay;
  ScopeSlots local_1b0;
  Type *local_1a8;
  Type *stackScopeSlots_1;
  FrameDisplay *stackFrameDisplay_1;
  ScriptFunction *local_190;
  ScriptFunction *boxedFunction;
  StackScriptFunction *stackFunction;
  uint i;
  uint nestedCount;
  Type *local_170;
  Type *boxedScopeSlots;
  Type *stackScopeSlots;
  FrameDisplay *boxedFrameDisplay;
  FrameDisplay *stackFrameDisplay;
  char16 *frameKind;
  char16 debugStringBuffer [42];
  InterpreterStackFrame *interpreterFrame;
  FunctionBody *callerFunctionBody;
  ScriptFunction *callerScriptFunction;
  JavascriptFunction *pJStack_c0;
  bool hasInlineeToBox;
  JavascriptFunction *caller;
  JavascriptStackWalker walker;
  BoxState *this_local;
  
  walker.currentFrame.stackCheckCodeHeight = (size_t)this;
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)&caller,this->scriptContext,true,this->returnAddress,false);
  bVar4 = false;
  do {
    do {
      BVar7 = JavascriptStackWalker::GetCaller
                        ((JavascriptStackWalker *)&caller,&stack0xffffffffffffff40,true);
      if (BVar7 == 0) {
        if (bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                      ,400,"(!hasInlineeToBox)","!hasInlineeToBox");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        Finish(this);
        JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)&caller);
        return;
      }
      BVar7 = JavascriptFunction::IsScriptFunction(pJStack_c0);
    } while (BVar7 == 0);
    pSVar10 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(pJStack_c0);
    functionBody = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar10);
    if ((bVar4) || (bVar3 = NeedBoxFrame(this,functionBody), bVar3)) {
      register0x00000000 =
           JavascriptStackWalker::GetCurrentInterpreterFrame((JavascriptStackWalker *)&caller);
      bVar3 = NeedBoxFrame(this,functionBody);
      if ((bVar3) ||
         ((bVar4 && (bVar3 = JavascriptStackWalker::IsInlineFrame((JavascriptStackWalker *)&caller),
                    !bVar3)))) {
        if (stack0xffffffffffffff10 == (InterpreterStackFrame *)0x0) {
          bVar3 = JavascriptStackWalker::IsInlineFrame((JavascriptStackWalker *)&caller);
          if (bVar3) {
            bVar3 = NeedBoxFrame(this,functionBody);
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                          ,0xb4,"(this->NeedBoxFrame(callerFunctionBody))",
                                          "this->NeedBoxFrame(callerFunctionBody)");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 0;
            }
            stackFrameDisplay = (FrameDisplay *)anon_var_dwarf_608c926;
          }
          else {
            bVar3 = NeedBoxFrame(this,functionBody);
            if (bVar3) {
              stackFrameDisplay = (FrameDisplay *)0x176c3c8;
              if (bVar4) {
                stackFrameDisplay = (FrameDisplay *)L"Native and Inlinee";
              }
            }
            else {
              stackFrameDisplay = (FrameDisplay *)anon_var_dwarf_608c950;
            }
          }
        }
        else {
          if (bVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                        ,0xae,"(!hasInlineeToBox)","!hasInlineeToBox");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          bVar3 = JavascriptStackWalker::IsBailedOutFromInlinee((JavascriptStackWalker *)&caller);
          if (bVar3) {
            local_258 = (FrameDisplay *)0x19598e0;
          }
          else {
            bVar3 = JavascriptStackWalker::IsBailedOutFromFunction((JavascriptStackWalker *)&caller)
            ;
            local_258 = (FrameDisplay *)0x1778ed6;
            if (bVar3) {
              local_258 = (FrameDisplay *)0x1959936;
            }
          }
          stackFrameDisplay = local_258;
        }
        uVar9 = FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
        bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackFuncPhase,uVar9,functionId);
        pFVar2 = stackFrameDisplay;
        if (bVar3) {
          iVar8 = (*(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])();
          pcVar12 = FunctionProxy::GetDebugNumberSet
                              ((FunctionProxy *)functionBody,(wchar (*) [42])&frameKind);
          Output::Print(L"Boxing Frame [%s]: %s %s\n",pFVar2,CONCAT44(extraout_var,iVar8),pcVar12);
          Output::Flush();
        }
      }
      if (stack0xffffffffffffff10 == (InterpreterStackFrame *)0x0) {
        bVar3 = JavascriptStackWalker::IsInlineFrame((JavascriptStackWalker *)&caller);
        if (bVar3) {
          bVar3 = JavascriptStackWalker::IsCurrentPhysicalFrameForLoopBody
                            ((JavascriptStackWalker *)&caller);
          if (!bVar3) {
            bVar4 = true;
          }
        }
        else {
          bVar4 = false;
          bVar3 = FunctionBody::DoStackFrameDisplay(functionBody);
          if ((bVar3) &&
             (stackScopeSlots_1 =
                   (Type *)GetFrameDisplayFromNativeFrame
                                     (this,(JavascriptStackWalker *)&caller,functionBody),
             (FrameDisplay *)stackScopeSlots_1 != (FrameDisplay *)0x0)) {
            BoxFrameDisplay(this,(FrameDisplay *)stackScopeSlots_1);
          }
          bVar3 = FunctionBody::DoStackScopeSlots(functionBody);
          if ((bVar3) &&
             (pTVar14 = (Type *)GetScopeSlotsFromNativeFrame
                                          (this,(JavascriptStackWalker *)&caller,functionBody),
             local_1a8 = pTVar14, pTVar14 != (Type *)0x0)) {
            ScopeSlots::ScopeSlots(&local_1b0,pTVar14);
            sVar16 = ScopeSlots::GetCount(&local_1b0);
            BoxScopeSlots(this,pTVar14,(uint)sVar16);
          }
          BoxNativeFrame(this,(JavascriptStackWalker *)&caller,functionBody);
          uVar9 = ParseableFunctionInfo::GetNestedCount(&functionBody->super_ParseableFunctionInfo);
          if (uVar9 != 0) {
            ForEachStackNestedFunctionNative<Js::StackScriptFunction::BoxState::Box()::__1>
                      (this,(JavascriptStackWalker *)&caller,functionBody,
                       (anon_class_8_1_8991fb9c)this);
          }
        }
      }
      else {
        if (bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                      ,200,"(!hasInlineeToBox)","!hasInlineeToBox");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        function = InterpreterStackFrame::GetJavascriptFunction(stack0xffffffffffffff10);
        pJVar13 = GetCurrentFunctionObject((JavascriptFunction *)function);
        if (pJVar13 != pJStack_c0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                      ,0xca,
                                      "(StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller)"
                                      ,
                                      "StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller"
                                     );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        bVar3 = FunctionBody::DoStackFrameDisplay(functionBody);
        if (((bVar3) &&
            (bVar3 = InterpreterStackFrame::IsClosureInitDone(stack0xffffffffffffff10), bVar3)) &&
           (boxedFrameDisplay = InterpreterStackFrame::GetLocalFrameDisplay(stack0xffffffffffffff10)
           , boxedFrameDisplay != (FrameDisplay *)0x0)) {
          stackScopeSlots = (Type *)BoxFrameDisplay(this,boxedFrameDisplay);
          InterpreterStackFrame::SetLocalFrameDisplay
                    (stack0xffffffffffffff10,(FrameDisplay *)stackScopeSlots);
        }
        bVar3 = FunctionBody::DoStackScopeSlots(functionBody);
        if (((bVar3) &&
            (bVar3 = InterpreterStackFrame::IsClosureInitDone(stack0xffffffffffffff10), bVar3)) &&
           (pTVar14 = (Type *)InterpreterStackFrame::GetLocalClosure(stack0xffffffffffffff10),
           boxedScopeSlots = pTVar14, pTVar14 != (Type *)0x0)) {
          ScopeSlots::ScopeSlots((ScopeSlots *)&i,pTVar14);
          sVar16 = ScopeSlots::GetCount((ScopeSlots *)&i);
          local_170 = BoxScopeSlots(this,pTVar14,(uint)sVar16);
          InterpreterStackFrame::SetLocalClosure(stack0xffffffffffffff10,local_170);
        }
        stackFunction._4_4_ =
             ParseableFunctionInfo::GetNestedCount(&functionBody->super_ParseableFunctionInfo);
        for (stackFunction._0_4_ = 0; (uint)stackFunction < stackFunction._4_4_;
            stackFunction._0_4_ = (uint)stackFunction + 1) {
          boxedFunction =
               &InterpreterStackFrame::GetStackNestedFunction
                          (stack0xffffffffffffff10,(uint)stackFunction)->super_ScriptFunction;
          local_190 = BoxStackFunction(this,boxedFunction);
          if ((ScriptFunction *)
              boxedFunction[1].super_ScriptFunctionBase.super_JavascriptFunction.super_DynamicObject
              .super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject != local_190) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                        ,0xe9,
                                        "(stackFunction->boxedScriptFunction == boxedFunction)",
                                        "stackFunction->boxedScriptFunction == boxedFunction");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          UpdateFrameDisplay(this,boxedFunction);
        }
        bVar3 = JavascriptStackWalker::IsBailedOutFromInlinee((JavascriptStackWalker *)&caller);
        if (bVar3) {
          bVar3 = JavascriptStackWalker::IsCurrentPhysicalFrameForLoopBody
                            ((JavascriptStackWalker *)&caller);
          if (!bVar3) {
            bVar4 = true;
          }
        }
        else {
          bVar3 = JavascriptStackWalker::IsBailedOutFromFunction((JavascriptStackWalker *)&caller);
          if (bVar3) {
            BoxNativeFrame(this,(JavascriptStackWalker *)&caller,functionBody);
            uVar9 = ParseableFunctionInfo::GetNestedCount
                              (&functionBody->super_ParseableFunctionInfo);
            if (uVar9 != 0) {
              stackFrameDisplay_1 = (FrameDisplay *)this;
              ForEachStackNestedFunctionNative<Js::StackScriptFunction::BoxState::Box()::__0>
                        (this,(JavascriptStackWalker *)&caller,functionBody,
                         (anon_class_8_1_8991fb9c)this);
            }
          }
        }
      }
    }
    else {
      bVar3 = FunctionBody::DoStackFrameDisplay(functionBody);
      if ((bVar3) &&
         (bVar3 = JavascriptStackWalker::IsInlineFrame((JavascriptStackWalker *)&caller), !bVar3)) {
        pIVar17 = JavascriptStackWalker::GetCurrentInterpreterFrame
                            ((JavascriptStackWalker *)&caller);
        slotArray._7_1_ = true;
        if (pIVar17 == (InterpreterStackFrame *)0x0) {
          ppvVar15 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)&caller);
          AVar5 = ParseableFunctionInfo::GetInParamsCount
                            (&functionBody->super_ParseableFunctionInfo);
          iVar8 = -5;
          if (AVar5 == 0) {
            iVar8 = -4;
          }
          interpreterFrame_1 = (InterpreterStackFrame *)ppvVar15[iVar8];
        }
        else {
          interpreterFrame_1 =
               (InterpreterStackFrame *)InterpreterStackFrame::GetLocalFrameDisplay(pIVar17);
          slotArray._7_1_ = InterpreterStackFrame::IsClosureInitDone(pIVar17);
        }
        bVar3 = ThreadContext::IsOnStack(interpreterFrame_1);
        if ((bVar3) && (slotArray._7_1_ != false)) {
          for (slotArray._0_4_ = 0;
              uVar6 = FrameDisplay::GetLength((FrameDisplay *)interpreterFrame_1),
              (int)(uint)slotArray < (int)(uint)uVar6; slotArray._0_4_ = (uint)slotArray + 1) {
            slots.slotArray.ptr =
                 (Type)FrameDisplay::GetItem((FrameDisplay *)interpreterFrame_1,(uint)slotArray);
            bVar3 = ScopeSlots::Is((void *)slots.slotArray.ptr);
            if (bVar3) {
              ScopeSlots::ScopeSlots((ScopeSlots *)&functionProxy,(Type *)slots.slotArray.ptr);
              bVar3 = ScopeSlots::IsDebuggerScopeSlotArray((ScopeSlots *)&functionProxy);
              if (!bVar3) {
                this_00 = ScopeSlots::GetFunctionInfo((ScopeSlots *)&functionProxy);
                pScope = (Type *)FunctionInfo::GetFunctionProxy(this_00);
                bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)pScope);
                if (bVar3) {
                  functionBody_00 = FunctionProxy::GetFunctionBody((FunctionProxy *)pScope);
                  bVar3 = NeedBoxFrame(this,functionBody_00);
                  if (bVar3) break;
                }
              }
            }
          }
          for (; uVar6 = FrameDisplay::GetLength((FrameDisplay *)interpreterFrame_1),
              (int)(uint)slotArray < (int)(uint)uVar6; slotArray._0_4_ = (uint)slotArray + 1) {
            boxedSlots = (Type *)FrameDisplay::GetItem
                                           ((FrameDisplay *)interpreterFrame_1,(uint)slotArray);
            bVar3 = ScopeSlots::Is(boxedSlots);
            pTVar14 = boxedSlots;
            if (bVar3) {
              ScopeSlots::ScopeSlots((ScopeSlots *)&boxedCaller,boxedSlots);
              sVar16 = ScopeSlots::GetCount((ScopeSlots *)&boxedCaller);
              local_1f8 = BoxScopeSlots(this,pTVar14,(uint)sVar16);
              FrameDisplay::SetItem((FrameDisplay *)interpreterFrame_1,(uint)slotArray,local_1f8);
            }
          }
        }
      }
    }
    bVar3 = NeedBoxScriptFunction(this,pSVar10);
    if ((bVar3) && (bVar3 = ThreadContext::IsOnStack(pSVar10), bVar3)) {
      scriptFunction = VarTo<Js::StackScriptFunction,Js::ScriptFunction>(pSVar10);
      pSVar10 = BoxStackFunction(this,&scriptFunction->super_ScriptFunction);
      JavascriptStackWalker::SetCurrentFunction
                ((JavascriptStackWalker *)&caller,(JavascriptFunction *)pSVar10);
      pIVar17 = JavascriptStackWalker::GetCurrentInterpreterFrame((JavascriptStackWalker *)&caller);
      if (pIVar17 != (InterpreterStackFrame *)0x0) {
        InterpreterStackFrame::SetExecutingStackFunction(pIVar17,pSVar10);
      }
      uVar9 = ParseableFunctionInfo::GetNestedCount(&functionBody->super_ParseableFunctionInfo);
      if (uVar9 != 0) {
        ForEachStackNestedFunction<Js::StackScriptFunction::BoxState::Box()::__2>
                  (this,(JavascriptStackWalker *)&caller,functionBody,(anon_class_8_1_8991fb9c)this)
        ;
      }
    }
  } while( true );
}

Assistant:

void StackScriptFunction::BoxState::Box()
    {
        JavascriptStackWalker walker(scriptContext, true, returnAddress);
        JavascriptFunction * caller;
        bool hasInlineeToBox = false;
        while (walker.GetCaller(&caller))
        {
            if (!caller->IsScriptFunction())
            {
                continue;
            }

            ScriptFunction * callerScriptFunction = VarTo<ScriptFunction>(caller);
            FunctionBody * callerFunctionBody = callerScriptFunction->GetFunctionBody();
            if (hasInlineeToBox || this->NeedBoxFrame(callerFunctionBody))
            {
                // Box the frame display, but don't need to box the function unless we see them
                // in the slots.

                // If the frame display has any stack nested function, then it must have given to one of the
                // stack functions.  If it doesn't appear in  on eof the stack function , the frame display
                // doesn't contain any stack function
                InterpreterStackFrame * interpreterFrame = walker.GetCurrentInterpreterFrame();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                if (this->NeedBoxFrame(callerFunctionBody) || (hasInlineeToBox && !walker.IsInlineFrame()))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    char16 const * frameKind;
                    if (interpreterFrame)
                    {
                        Assert(!hasInlineeToBox);
                        frameKind = walker.IsBailedOutFromInlinee()? _u("Interpreted from Inlined Bailout (Pending)") :
                            walker.IsBailedOutFromFunction()? _u("Interpreted from Bailout") : _u("Interpreted");
                    }
                    else if (walker.IsInlineFrame())
                    {
                        Assert(this->NeedBoxFrame(callerFunctionBody));
                        frameKind = _u("Native Inlined (Pending)");
                    }
                    else if (this->NeedBoxFrame(callerFunctionBody))
                    {
                        frameKind = (hasInlineeToBox? _u("Native and Inlinee") : _u("Native"));
                    }
                    else
                    {
                        frameKind = _u("Native for Inlinee");
                    }

                    PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, callerFunctionBody,
                        _u("Boxing Frame [%s]: %s %s\n"), frameKind,
                        callerFunctionBody->GetDisplayName(), callerFunctionBody->GetDebugNumberSet(debugStringBuffer));
                }
#endif

                if (interpreterFrame)
                {
                    Assert(!hasInlineeToBox);

                    Assert(StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller);

                    if (callerFunctionBody->DoStackFrameDisplay() && interpreterFrame->IsClosureInitDone())
                    {
                        Js::FrameDisplay *stackFrameDisplay = interpreterFrame->GetLocalFrameDisplay();
                        // Local frame display may be null if bailout didn't restore it, which means we don't need it.
                        if (stackFrameDisplay)
                        {
                            Js::FrameDisplay *boxedFrameDisplay = this->BoxFrameDisplay(stackFrameDisplay);
                            interpreterFrame->SetLocalFrameDisplay(boxedFrameDisplay);
                        }
                    }
                    if (callerFunctionBody->DoStackScopeSlots() && interpreterFrame->IsClosureInitDone())
                    {
                        Field(Var)* stackScopeSlots = (Field(Var)*)interpreterFrame->GetLocalClosure();
                        if (stackScopeSlots)
                        {
                            // Scope slot pointer may be null if bailout didn't restore it, which means we don't need it.
                            Field(Var)* boxedScopeSlots = this->BoxScopeSlots(stackScopeSlots, static_cast<uint>(ScopeSlots(stackScopeSlots).GetCount()));
                            interpreterFrame->SetLocalClosure(boxedScopeSlots);
                        }
                    }

                    uint nestedCount = callerFunctionBody->GetNestedCount();
                    for (uint i = 0; i < nestedCount; i++)
                    {
                        // Box the stack function, even if they might not be "created" in the byte code yet.
                        // Some of them will not be captured in slots, so we just need to box them and record it with the
                        // stack func so that when we can just use the boxed value when we need it.
                        StackScriptFunction * stackFunction = interpreterFrame->GetStackNestedFunction(i);
                        ScriptFunction * boxedFunction = this->BoxStackFunction(stackFunction);
                        Assert(stackFunction->boxedScriptFunction == boxedFunction);
                        this->UpdateFrameDisplay(stackFunction);
                    }

                    if (walker.IsBailedOutFromInlinee())
                    {
                        if (!walker.IsCurrentPhysicalFrameForLoopBody())
                        {
                            // this is the interpret frame from bailing out of inline frame
                            // Just mark we have inlinee to box so we will walk the native frame's list when we get there.
                            hasInlineeToBox = true;
                        }
                    }
                    else if (walker.IsBailedOutFromFunction())
                    {
                        // The current interpret frame is from bailing out of a native frame.
                        // Walk native frame that was bailed out as well.
                        // The stack walker is pointing to the native frame already.
                        this->BoxNativeFrame(walker, callerFunctionBody);

                        // We don't need to box this frame, but we may still need to box the scope slot references
                        // within nested frame displays if the slots they refer to have been boxed.
                        if (callerFunctionBody->GetNestedCount() != 0)
                        {
                            this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                            {
                                this->UpdateFrameDisplay(nestedFunc);
                            });
                        }
                    }
                }
                else
                {
                    if (walker.IsInlineFrame())
                    {
                        if (!walker.IsCurrentPhysicalFrameForLoopBody())
                        {
                            // We may have function that are not in slots.  So we have to walk the stack function list of the inliner
                            // to box all the needed function to catch those
                            hasInlineeToBox = true;
                        }
                    }
                    else
                    {
                        hasInlineeToBox = false;

                        if (callerFunctionBody->DoStackFrameDisplay())
                        {
                            Js::FrameDisplay *stackFrameDisplay =
                                this->GetFrameDisplayFromNativeFrame(walker, callerFunctionBody);
                            // Local frame display may be null if bailout didn't restore it, which means we don't need it.
                            if (stackFrameDisplay)
                            {
                                this->BoxFrameDisplay(stackFrameDisplay);
                            }
                        }
                        if (callerFunctionBody->DoStackScopeSlots())
                        {
                            Field(Var)* stackScopeSlots = (Field(Var)*)this->GetScopeSlotsFromNativeFrame(walker, callerFunctionBody);
                            if (stackScopeSlots)
                            {
                                // Scope slot pointer may be null if bailout didn't restore it, which means we don't need it.
                                this->BoxScopeSlots(stackScopeSlots, static_cast<uint>(ScopeSlots(stackScopeSlots).GetCount()));
                            }
                        }

                        // walk native frame
                        this->BoxNativeFrame(walker, callerFunctionBody);

                        // We don't need to box this frame, but we may still need to box the scope slot references
                        // within nested frame displays if the slots they refer to have been boxed.
                        if (callerFunctionBody->GetNestedCount() != 0)
                        {
                            this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                            {
                                this->UpdateFrameDisplay(nestedFunc);
                            });
                        }
                    }
                }
            }
            else if (callerFunctionBody->DoStackFrameDisplay() && !walker.IsInlineFrame())
            {
                // The case here is that a frame need not be boxed, but the closure environment in that frame
                // refers to an outer boxed frame.
                // Find the FD and walk it looking for a slot array that refers to a FB that must be boxed.
                // Everything from that point outward must be boxed.
                FrameDisplay *frameDisplay;
                InterpreterStackFrame *interpreterFrame = walker.GetCurrentInterpreterFrame();
                bool closureInitDone = true; // Set to true as for native frame bailout will always restore the frameDisplay but for interpreter frame if PROBE_STACK fails closureInitDone won't have completed.

                if (interpreterFrame)
                {
                    frameDisplay = interpreterFrame->GetLocalFrameDisplay();
                    closureInitDone = interpreterFrame->IsClosureInitDone();
                }
                else
                {
                    frameDisplay = (Js::FrameDisplay*)walker.GetCurrentArgv()[
#if _M_IX86 || _M_AMD64
                        callerFunctionBody->GetInParamsCount() == 0 ?
                        JavascriptFunctionArgIndex_StackFrameDisplayNoArg :
#endif
                        JavascriptFunctionArgIndex_StackFrameDisplay];
                }
                if (ThreadContext::IsOnStack(frameDisplay) && closureInitDone)
                {
                    int i;
                    for (i = 0; i < frameDisplay->GetLength(); i++)
                    {
                        Field(Var) *slotArray = (Field(Var)*)frameDisplay->GetItem(i);

                        if (ScopeSlots::Is(slotArray))
                        {
                            ScopeSlots slots(slotArray);
                            if (!slots.IsDebuggerScopeSlotArray())
                            {
                                FunctionProxy *functionProxy = slots.GetFunctionInfo()->GetFunctionProxy();
                                if (functionProxy->IsFunctionBody() && this->NeedBoxFrame(functionProxy->GetFunctionBody()))
                                {
                                    break;
                                }
                            }
                        }
                    }
                    for (; i < frameDisplay->GetLength(); i++)
                    {
                        Field(Var) *pScope = (Field(Var)*)frameDisplay->GetItem(i);
                        if (ScopeSlots::Is(pScope))
                        {
                            Field(Var) *boxedSlots = this->BoxScopeSlots(pScope, static_cast<uint>(ScopeSlots(pScope).GetCount()));
                            frameDisplay->SetItem(i, boxedSlots);
                        }
                    }
                }
            }

            ScriptFunction * boxedCaller = nullptr;
            if (this->NeedBoxScriptFunction(callerScriptFunction))
            {
                // TODO-STACK-NESTED-FUNC: Can't assert this yet, JIT might not do stack func allocation
                // if the function hasn't been parsed or deserialized yet.
                // Assert(ThreadContext::IsOnStack(callerScriptFunction));
                if (ThreadContext::IsOnStack(callerScriptFunction))
                {
                    boxedCaller = this->BoxStackFunction(VarTo<StackScriptFunction>(callerScriptFunction));
                    walker.SetCurrentFunction(boxedCaller);

                    InterpreterStackFrame * interpreterFrame = walker.GetCurrentInterpreterFrame();
                    if (interpreterFrame)
                    {
                        interpreterFrame->SetExecutingStackFunction(boxedCaller);
                    }

                    // We don't need to box this frame, but we may still need to box the scope slot references
                    // within nested frame displays if the slots they refer to have been boxed.
                    if (callerFunctionBody->GetNestedCount() != 0)
                    {
                        this->ForEachStackNestedFunction(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                        {
                            this->UpdateFrameDisplay(nestedFunc);
                        });
                    }
                }
            }
        }

        Assert(!hasInlineeToBox);

        // We have to find one nested function
        this->Finish();
    }